

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::Player(Player *this,Dice *d,int i)

{
  allocator local_59;
  string local_58 [32];
  string local_38;
  
  Player(this);
  this->dice = d;
  this->playerID = i;
  Dice::setPlayerNumber(d,i);
  std::__cxx11::to_string(&local_38,i);
  std::__cxx11::string::string(local_58,"Random ",&local_59);
  std::__cxx11::string::append(local_58);
  std::__cxx11::string::_M_assign((string *)&this->playerName);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this->ownedZone = 10;
  return;
}

Assistant:

Player::Player(Dice* d, int i): Player() {
    this ->dice = d ;
    this ->playerID = i;
    this ->dice->setPlayerNumber(i);
    this ->setPlayerName(std::string("Random ") += to_string(i));
    this ->setZone(10); // Nothing
}